

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSWorkerMessagePipe * js_new_message_pipe(void)

{
  int iVar1;
  int pipe_fds [2];
  JSWorkerMessagePipe *ps;
  int local_18;
  int local_14;
  JSWorkerMessagePipe *local_10;
  JSWorkerMessagePipe *local_8;
  
  iVar1 = pipe(&local_18);
  if (iVar1 < 0) {
    local_8 = (JSWorkerMessagePipe *)0x0;
  }
  else {
    local_10 = (JSWorkerMessagePipe *)malloc(0x48);
    if (local_10 == (JSWorkerMessagePipe *)0x0) {
      close(local_18);
      close(local_14);
      local_8 = (JSWorkerMessagePipe *)0x0;
    }
    else {
      local_10->ref_count = 1;
      init_list_head(&local_10->msg_queue);
      pthread_mutex_init((pthread_mutex_t *)&local_10->mutex,(pthread_mutexattr_t *)0x0);
      local_10->read_fd = local_18;
      local_10->write_fd = local_14;
      local_8 = local_10;
    }
  }
  return local_8;
}

Assistant:

static JSWorkerMessagePipe *js_new_message_pipe(void)
{
    JSWorkerMessagePipe *ps;
    int pipe_fds[2];
    
    if (pipe(pipe_fds) < 0)
        return NULL;

    ps = malloc(sizeof(*ps));
    if (!ps) {
        close(pipe_fds[0]);
        close(pipe_fds[1]);
        return NULL;
    }
    ps->ref_count = 1;
    init_list_head(&ps->msg_queue);
    pthread_mutex_init(&ps->mutex, NULL);
    ps->read_fd = pipe_fds[0];
    ps->write_fd = pipe_fds[1];
    return ps;
}